

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

int secp256k1_modinv32_mul_cmp_30
              (secp256k1_modinv32_signed30 *a,int alen,secp256k1_modinv32_signed30 *b,int32_t factor
              )

{
  secp256k1_scalar *a_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  int extraout_EAX_03;
  uint32_t uVar7;
  int extraout_EAX_04;
  long lVar8;
  ulong uVar9;
  secp256k1_modinv32_signed30 *psVar10;
  int iVar11;
  secp256k1_modinv32_signed30 *b_00;
  int extraout_EDX;
  uint uVar12;
  uint uVar13;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar14;
  long lVar15;
  secp256k1_modinv32_signed30 *b_01;
  ulong uVar16;
  long *extraout_RDX_01;
  int *piVar17;
  int iVar18;
  ulong uVar19;
  uint64_t uVar20;
  uint uVar21;
  uint uVar22;
  secp256k1_fe *psVar23;
  ulong uVar24;
  secp256k1_fe *r;
  secp256k1_modinv32_signed30 *a_01;
  long lVar25;
  secp256k1_modinv32_signed30 *psVar26;
  ulong uVar27;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar28;
  uchar *__s;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  int *piVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  secp256k1_modinv32_signed30 *psVar37;
  ulong uVar38;
  uint uVar39;
  secp256k1_modinv32_signed30 *psVar40;
  uint64_t uVar41;
  size_t count;
  uint64_t uVar42;
  secp256k1_fe *a_02;
  uint uVar43;
  uint64_t uVar44;
  code *pcVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  secp256k1_modinv32_signed30 bm;
  secp256k1_modinv32_signed30 am;
  ulong uStack_1370;
  secp256k1_fe *psStack_1368;
  uchar auStack_1360 [4232];
  secp256k1_fe *psStack_2d8;
  ulong uStack_2d0;
  uint64_t uStack_2c8;
  secp256k1_fe *psStack_2c0;
  code *pcStack_2b8;
  code *pcStack_2b0;
  undefined1 auStack_2a8 [36];
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int iStack_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  undefined1 auStack_268 [48];
  code *pcStack_238;
  long lStack_228;
  secp256k1_fe sStack_220;
  secp256k1_fe *psStack_1e8;
  secp256k1_fe sStack_1e0;
  secp256k1_fe sStack_1b0;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  secp256k1_modinv32_signed30 *psStack_160;
  ulong uStack_158;
  code *pcStack_150;
  uint uStack_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  secp256k1_modinv32_signed30 *psStack_130;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint uStack_118;
  int32_t iStack_114;
  secp256k1_modinv32_signed30 *psStack_110;
  secp256k1_modinv32_signed30 *psStack_108;
  secp256k1_modinv32_signed30 *psStack_100;
  secp256k1_modinv32_signed30 *psStack_f8;
  secp256k1_modinv32_signed30 *psStack_f0;
  code *pcStack_e8;
  long lStack_d8;
  long lStack_d0;
  int *piStack_c8;
  secp256k1_modinv32_signed30 local_58;
  secp256k1_modinv32_signed30 local_34;
  
  psVar26 = &local_58;
  piVar17 = (int *)(ulong)(uint)factor;
  secp256k1_modinv32_mul_30(&local_34,a,alen,1);
  piVar33 = piVar17;
  secp256k1_modinv32_mul_30(&local_58,b,9,factor);
  lVar8 = 0;
  while ((uint)local_34.v[lVar8] < 0x40000000) {
    if (0x3fffffff < (uint)local_58.v[lVar8]) goto LAB_00153d93;
    lVar8 = lVar8 + 1;
    if (lVar8 == 8) {
      uVar3 = 8;
      while( true ) {
        if (local_34.v[uVar3] < local_58.v[uVar3]) {
          return -1;
        }
        if (local_58.v[uVar3] < local_34.v[uVar3]) break;
        bVar46 = uVar3 == 0;
        uVar3 = uVar3 - 1;
        if (bVar46) {
          return 0;
        }
      }
      return 1;
    }
  }
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00153d93:
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar4 = (int)psVar26;
  if (iVar4 < 1) {
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_00153e86:
    iVar11 = (int)piVar33;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar18 = piVar33[1];
    iVar1 = *piVar33;
    piVar17 = (int *)(long)b->v[0];
    uVar9 = (long)*extraout_RDX * (long)iVar18 + (long)piVar17 * (long)iVar1;
    if ((uVar9 & 0x3fffffff) != 0) goto LAB_00153e86;
    iVar2 = piVar33[3];
    iVar11 = piVar33[2];
    piVar17 = (int *)((long)piVar17 * (long)iVar11);
    piVar33 = (int *)((long)*extraout_RDX * (long)iVar2 + (long)piVar17);
    if (((ulong)piVar33 & 0x3fffffff) == 0) {
      lVar34 = (long)piVar33 >> 0x1e;
      lVar8 = (long)uVar9 >> 0x1e;
      if (iVar4 != 1) {
        uVar9 = 1;
        do {
          lVar8 = (long)extraout_RDX[uVar9] * (long)iVar18 + (long)b->v[uVar9] * (long)iVar1 + lVar8
          ;
          lVar34 = (long)extraout_RDX[uVar9] * (long)iVar2 +
                   (long)b->v[uVar9] * (long)iVar11 + lVar34;
          b->v[uVar9 - 1] = (uint)lVar8 & 0x3fffffff;
          extraout_RDX[uVar9 - 1] = (uint)lVar34 & 0x3fffffff;
          uVar9 = uVar9 + 1;
          lVar34 = lVar34 >> 0x1e;
          lVar8 = lVar8 >> 0x1e;
        } while (((ulong)psVar26 & 0xffffffff) != uVar9);
      }
      b->v[(long)iVar4 + -1] = (int)lVar8;
      extraout_RDX[(long)iVar4 + -1] = (int)lVar34;
      return (int)lVar8;
    }
  }
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar8 = 0;
  psVar10 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar8 < extraout_EDX) {
      psVar10 = (secp256k1_modinv32_signed30 *)((long)psVar10->v + (long)b->v[lVar8] * (long)iVar11)
      ;
    }
    psVar26->v[lVar8] = (uint)psVar10 & 0x3fffffff;
    psVar10 = (secp256k1_modinv32_signed30 *)((long)psVar10 >> 0x1e);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  if (8 < extraout_EDX) {
    psVar10 = (secp256k1_modinv32_signed30 *)((long)psVar10->v + (long)b->v[8] * (long)iVar11);
  }
  iVar4 = (int)psVar10;
  b_00 = (secp256k1_modinv32_signed30 *)(long)iVar4;
  if (b_00 == psVar10) {
    psVar26->v[8] = iVar4;
    return iVar4;
  }
  secp256k1_modinv32_mul_30_cold_1();
  uVar3 = *extraout_RDX_00;
  psVar40 = (secp256k1_modinv32_signed30 *)(long)(int)uVar3;
  uVar13 = extraout_RDX_00[1];
  lVar8 = (long)(int)uVar13;
  uVar22 = extraout_RDX_00[2];
  psVar10 = (secp256k1_modinv32_signed30 *)(long)(int)uVar22;
  lStack_d8 = (long)(int)extraout_RDX_00[3];
  psVar23 = (secp256k1_fe *)0x9;
  pcStack_e8 = (code *)0x153f25;
  a_01 = psVar26;
  piStack_c8 = piVar17;
  iVar4 = secp256k1_modinv32_mul_cmp_30(psVar26,9,b_00,-2);
  if (iVar4 < 1) {
    pcStack_e8 = (code *)0x15418d;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0015418d:
    pcStack_e8 = (code *)0x154192;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00154192:
    pcStack_e8 = (code *)0x154197;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_00154197:
    pcStack_e8 = (code *)0x15419c;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0015419c:
    pcStack_e8 = (code *)0x1541a1;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_001541a1:
    pcStack_e8 = (code *)0x1541a6;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_001541a6:
    pcStack_e8 = (code *)0x1541ab;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_001541ab:
    pcStack_e8 = (code *)0x1541b0;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar37 = b_00;
LAB_001541b0:
    pcStack_e8 = (code *)0x1541b5;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001541b5:
    pcStack_e8 = (code *)0x1541ba;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001541ba:
    pcStack_e8 = (code *)0x1541bf;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x153f42;
    a_01 = psVar26;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar26,9,b_00,1);
    if (-1 < iVar4) goto LAB_0015418d;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x153f5f;
    a_01 = b;
    iVar4 = secp256k1_modinv32_mul_cmp_30(b,9,b_00,-2);
    if (iVar4 < 1) goto LAB_00154192;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x153f7c;
    a_01 = b;
    iVar4 = secp256k1_modinv32_mul_cmp_30(b,9,b_00,1);
    if (-1 < iVar4) goto LAB_00154197;
    psVar37 = (secp256k1_modinv32_signed30 *)-(long)psVar40;
    if (0 < (long)psVar40) {
      psVar37 = psVar40;
    }
    lVar34 = -lVar8;
    if (lVar8 < 1) {
      lVar34 = lVar8;
    }
    if (lVar34 + 0x40000000 < (long)psVar37) goto LAB_0015419c;
    psVar37 = (secp256k1_modinv32_signed30 *)-(long)psVar10;
    if (0 < (long)psVar10) {
      psVar37 = psVar10;
    }
    lVar34 = -lStack_d8;
    if (lStack_d8 < 1) {
      lVar34 = lStack_d8;
    }
    if (lVar34 + 0x40000000 < (long)psVar37) goto LAB_001541a1;
    uVar29 = psVar26->v[8] >> 0x1f;
    uVar21 = b->v[8] >> 0x1f;
    psVar23 = (secp256k1_fe *)(ulong)uVar21;
    iVar4 = (uVar21 & uVar13) + (uVar29 & uVar3);
    a_01 = (secp256k1_modinv32_signed30 *)(b->v[0] * lVar8 + (long)psVar26->v[0] * (long)psVar40);
    lVar34 = (long)(int)(iVar4 - ((int)a_01 * b_00[1].v[0] + iVar4 & 0x3fffffffU));
    piVar14 = (int32_t *)((long)a_01->v + lVar34 * b_00->v[0]);
    if (((ulong)piVar14 & 0x3fffffff) != 0) goto LAB_001541a6;
    lStack_d0 = lVar34;
    iVar4 = (uVar21 & (uint)lStack_d8) + (uVar29 & uVar22);
    lVar35 = b->v[0] * lStack_d8 + (long)psVar26->v[0] * (long)psVar10;
    a_01 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar3 = iVar4 - (b_00[1].v[0] * (int)lVar35 + iVar4 & 0x3fffffffU);
    psVar23 = (secp256k1_fe *)(ulong)uVar3;
    uVar9 = (long)b_00->v[0] * (long)(int)uVar3 + lVar35;
    if ((uVar9 & 0x3fffffff) != 0) goto LAB_001541ab;
    lVar35 = (long)uVar9 >> 0x1e;
    lVar15 = (long)piVar14 >> 0x1e;
    lVar25 = 1;
    do {
      lVar15 = b_00->v[lVar25] * lVar34 + b->v[lVar25] * lVar8 +
               (long)psVar26->v[lVar25] * (long)psVar40 + lVar15;
      psVar37 = (secp256k1_modinv32_signed30 *)(b->v[lVar25] * lStack_d8);
      lVar35 = (long)psVar37->v +
               (long)psVar26->v[lVar25] * (long)psVar10 + lVar35 +
               (long)b_00->v[lVar25] * (long)(int)uVar3;
      psVar26->v[lVar25 + -1] = (uint)lVar15 & 0x3fffffff;
      b->v[lVar25 + -1] = (uint)lVar35 & 0x3fffffff;
      lVar25 = lVar25 + 1;
      lVar35 = lVar35 >> 0x1e;
      lVar15 = lVar15 >> 0x1e;
    } while (lVar25 != 9);
    psVar26->v[8] = (int32_t)lVar15;
    b->v[8] = (int32_t)lVar35;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x154126;
    a_01 = psVar26;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar26,9,b_00,-2);
    psVar10 = b;
    psVar40 = b_00;
    if (iVar4 < 1) goto LAB_001541b0;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x154143;
    a_01 = psVar26;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar26,9,b_00,1);
    if (-1 < iVar4) goto LAB_001541b5;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x15415c;
    a_01 = b;
    iVar4 = secp256k1_modinv32_mul_cmp_30(b,9,b_00,-2);
    if (iVar4 < 1) goto LAB_001541ba;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_e8 = (code *)0x154175;
    a_01 = b;
    iVar4 = secp256k1_modinv32_mul_cmp_30(b,9,b_00,1);
    if (iVar4 < 0) {
      return iVar4;
    }
  }
  pcStack_e8 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_e8 = (code *)lVar8;
  psStack_f0 = psVar26;
  psStack_f8 = b;
  psStack_100 = psVar40;
  psStack_108 = psVar37;
  psStack_110 = psVar10;
  uVar3 = a_01->v[0];
  uVar24 = (ulong)uVar3;
  uVar13 = a_01->v[3];
  uVar16 = (ulong)uVar13;
  uVar22 = a_01->v[4];
  uVar19 = (ulong)uVar22;
  uVar21 = a_01->v[5];
  uVar38 = (ulong)uVar21;
  psVar26 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_01->v[6];
  uVar29 = a_01->v[7];
  uVar9 = (ulong)uVar29;
  iStack_114 = a_01->v[8];
  lVar8 = 0;
  do {
    if (a_01->v[lVar8] < -0x3fffffff) {
      pcStack_150 = (code *)0x15450d;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0015450d:
      pcStack_150 = (code *)0x154512;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00154512;
    }
    if (0x3fffffff < a_01->v[lVar8]) goto LAB_0015450d;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 9);
  uStack_134 = (uint)psVar23;
  psVar23 = (secp256k1_fe *)0x9;
  pcStack_150 = (code *)0x15424a;
  psVar26 = a_01;
  uStack_140 = a_01->v[1];
  uStack_13c = a_01->v[2];
  uStack_138 = a_01->v[6];
  psStack_130 = b_01;
  iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b_01,-2);
  if (iVar4 < 1) {
LAB_00154512:
    pcStack_150 = (code *)0x154517;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_00154517:
    pcStack_150 = (code *)0x15451c;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0015451c:
    pcStack_150 = (code *)0x154521;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00154521:
    pcStack_150 = (code *)0x154526;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_150 = (code *)0x154269;
    psVar26 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_130,1);
    if (-1 < iVar4) goto LAB_00154517;
    uVar5 = iStack_114 >> 0x1f;
    uStack_118 = psStack_130->v[1];
    uVar6 = (uVar5 & uStack_118) + uStack_140;
    uStack_140 = psStack_130->v[2];
    uVar12 = (uVar5 & uStack_140) + uStack_13c;
    uStack_13c = psStack_130->v[3];
    uStack_11c = psStack_130->v[4];
    uStack_120 = psStack_130->v[5];
    uStack_124 = psStack_130->v[6];
    uVar39 = (uVar5 & uStack_124) + uStack_138;
    uStack_138 = psStack_130->v[7];
    uStack_144 = (int)uStack_134 >> 0x1f;
    uStack_134 = psStack_130->v[8];
    uVar32 = ((uVar5 & psStack_130->v[0]) + uVar3 ^ uStack_144) - uStack_144;
    uVar30 = ((int)uVar32 >> 0x1e) + ((uVar6 ^ uStack_144) - uStack_144);
    uVar6 = ((int)uVar30 >> 0x1e) + ((uVar12 ^ uStack_144) - uStack_144);
    uVar43 = ((int)uVar6 >> 0x1e) + (((uVar5 & uStack_13c) + uVar13 ^ uStack_144) - uStack_144);
    uVar13 = ((int)uVar43 >> 0x1e) + (((uVar5 & uStack_11c) + uVar22 ^ uStack_144) - uStack_144);
    uVar3 = ((int)uVar13 >> 0x1e) + (((uVar5 & uStack_120) + uVar21 ^ uStack_144) - uStack_144);
    uVar22 = ((int)uVar3 >> 0x1e) + ((uVar39 ^ uStack_144) - uStack_144);
    uVar21 = ((int)uVar22 >> 0x1e) + (((uVar5 & uStack_138) + uVar29 ^ uStack_144) - uStack_144);
    uVar36 = ((int)uVar21 >> 0x1e) + (((uVar5 & uStack_134) + iStack_114 ^ uStack_144) - uStack_144)
    ;
    uVar38 = (ulong)uVar36;
    uStack_148 = (int)uVar36 >> 0x1f;
    uVar39 = (psStack_130->v[0] & uStack_148) + (uVar32 & 0x3fffffff);
    uVar12 = (uStack_120 & uStack_148) + (uVar3 & 0x3fffffff);
    uVar24 = (ulong)uVar12;
    uVar32 = (uStack_124 & uStack_148) + (uVar22 & 0x3fffffff);
    uVar16 = (ulong)uVar32;
    uVar3 = ((int)uVar39 >> 0x1e) + (uStack_118 & uStack_148) + (uVar30 & 0x3fffffff);
    uVar22 = ((int)uVar3 >> 0x1e) + (uStack_140 & uStack_148) + (uVar6 & 0x3fffffff);
    uVar29 = ((int)uVar22 >> 0x1e) + (uStack_13c & uStack_148) + (uVar43 & 0x3fffffff);
    uVar5 = ((int)uVar29 >> 0x1e) + (uStack_11c & uStack_148) + (uVar13 & 0x3fffffff);
    uVar12 = ((int)uVar5 >> 0x1e) + uVar12;
    uVar32 = ((int)uVar12 >> 0x1e) + uVar32;
    uVar13 = ((int)uVar32 >> 0x1e) + (uStack_138 & uStack_148) + (uVar21 & 0x3fffffff);
    uVar21 = ((int)uVar13 >> 0x1e) + (uStack_134 & uStack_148) + uVar36;
    uVar19 = (ulong)uVar21;
    uVar29 = uVar29 & 0x3fffffff;
    psVar23 = (secp256k1_fe *)(ulong)uVar29;
    uVar5 = uVar5 & 0x3fffffff;
    psVar26 = (secp256k1_modinv32_signed30 *)(ulong)uVar5;
    uVar13 = uVar13 & 0x3fffffff;
    uVar9 = (ulong)uVar13;
    a_01->v[0] = uVar39 & 0x3fffffff;
    a_01->v[1] = uVar3 & 0x3fffffff;
    a_01->v[2] = uVar22 & 0x3fffffff;
    a_01->v[3] = uVar29;
    a_01->v[4] = uVar5;
    a_01->v[5] = uVar12 & 0x3fffffff;
    a_01->v[6] = uVar32 & 0x3fffffff;
    a_01->v[7] = uVar13;
    a_01->v[8] = uVar21;
    if (0x3fffffff < uVar21) goto LAB_0015451c;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_150 = (code *)0x1544da;
    psVar26 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_130,0);
    if (iVar4 < 0) goto LAB_00154521;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_150 = (code *)0x1544f5;
    psVar26 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_130,1);
    if (iVar4 < 0) {
      return iVar4;
    }
  }
  pcStack_150 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_1e8 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_1e8 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_238 = (code *)0x154562;
  uStack_178 = uVar9;
  uStack_170 = uVar38;
  uStack_168 = uVar16;
  psStack_160 = a_01;
  uStack_158 = uVar24;
  pcStack_150 = (code *)uVar19;
  (*(code *)psStack_1e8)(&sStack_220);
  if (psVar26 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar26->v + 8) = sStack_220.n[4];
    *(ulong *)(psVar26[1].v + 1) = CONCAT44(sStack_220.normalized,sStack_220.magnitude);
    *(uint64_t *)(psVar26->v + 4) = sStack_220.n[2];
    *(uint64_t *)(psVar26->v + 6) = sStack_220.n[3];
    *(uint64_t *)psVar26->v = sStack_220.n[0];
    *(uint64_t *)(psVar26->v + 2) = sStack_220.n[1];
  }
  uVar44 = 0xfffffffffffff;
  uVar41 = 0xf000000000000;
  uVar19 = 0xffffffffffff;
  uVar38 = 0x1000003d0;
  sStack_1b0.n[0] = psVar23->n[0];
  sStack_1b0.n[1] = psVar23->n[1];
  sStack_1b0.n[2] = psVar23->n[2];
  sStack_1b0.n[3] = psVar23->n[3];
  sStack_1b0.n[4] = psVar23->n[4];
  sStack_1b0.magnitude = psVar23->magnitude;
  sStack_1b0.normalized = psVar23->normalized;
  a_02 = &sStack_1b0;
  pcStack_238 = (code *)0x1545d9;
  secp256k1_fe_verify(a_02);
  lStack_228 = 0x1000003d1;
  uVar9 = (sStack_1b0.n[4] >> 0x30) * 0x1000003d1 + sStack_1b0.n[0];
  if (((uVar9 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar9 & 0xfffffffffffff) == 0)) {
    uVar16 = (uVar9 >> 0x34) + sStack_1b0.n[1];
    uVar24 = (uVar16 >> 0x34) + sStack_1b0.n[2];
    uVar27 = (uVar24 >> 0x34) + sStack_1b0.n[3];
    uVar31 = (uVar27 >> 0x34) + (sStack_1b0.n[4] & 0xffffffffffff);
    if ((((uVar16 | uVar9 | uVar24 | uVar27) & 0xfffffffffffff) != 0 || uVar31 != 0) &&
       (((uVar9 | 0x1000003d0) & uVar16 & uVar24 & uVar27 & (uVar31 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015467c;
LAB_00154a90:
    psVar23 = &sStack_220;
    pcStack_238 = (code *)0x154a9d;
    secp256k1_fe_verify(psVar23);
    uVar19 = uVar19 & sStack_220.n[4];
    uVar9 = (sStack_220.n[4] >> 0x30) * lStack_228 + sStack_220.n[0];
    uVar16 = (uVar9 >> 0x34) + sStack_220.n[1];
    uVar24 = (uVar16 >> 0x34) + sStack_220.n[2];
    r = (secp256k1_fe *)((uVar24 >> 0x34) + sStack_220.n[3]);
    uVar27 = ((ulong)r >> 0x34) + uVar19;
    if (((uVar16 | uVar9 | uVar24 | (ulong)r) & uVar44) == 0 && uVar27 == 0) {
LAB_00154b07:
      return (int)uVar9;
    }
    r_00 = (secp256k1_fe *)(uVar27 ^ uVar41);
    uVar9 = (uVar9 ^ uVar38) & uVar16 & uVar24 & (ulong)r & (ulong)r_00;
    if (uVar9 == uVar44) goto LAB_00154b07;
  }
  else {
LAB_0015467c:
    pcStack_238 = (code *)0x154694;
    r = psVar23;
    secp256k1_fe_mul(&sStack_1b0,psVar23,&sStack_220);
    pcStack_238 = (code *)0x15469c;
    secp256k1_fe_verify(&sStack_1b0);
    r_00 = &fe_minus_one;
    pcStack_238 = (code *)0x1546a8;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_1b0.magnitude < 0x20) {
      sStack_1b0.n[0] = sStack_1b0.n[0] + 0xffffefffffc2e;
      sStack_1b0.n[1] = sStack_1b0.n[1] + 0xfffffffffffff;
      sStack_1b0.n[2] = sStack_1b0.n[2] + 0xfffffffffffff;
      sStack_1b0.n[3] = sStack_1b0.n[3] + 0xfffffffffffff;
      sStack_1b0.n[4] = sStack_1b0.n[4] + 0xffffffffffff;
      sStack_1b0.normalized = 0;
      sStack_1b0.magnitude = sStack_1b0.magnitude + 1;
      pcStack_238 = (code *)0x1546fd;
      secp256k1_fe_verify(&sStack_1b0);
      pcStack_238 = (code *)0x154705;
      secp256k1_fe_verify(&sStack_1b0);
      uVar9 = (sStack_1b0.n[4] >> 0x30) * lStack_228 + sStack_1b0.n[0];
      uVar19 = (uVar9 >> 0x34) + sStack_1b0.n[1];
      uVar16 = (uVar19 >> 0x34) + sStack_1b0.n[2];
      r = (secp256k1_fe *)((uVar16 >> 0x34) + sStack_1b0.n[3]);
      uVar24 = ((ulong)r >> 0x34) + (sStack_1b0.n[4] & 0xffffffffffff);
      if ((((uVar19 | uVar9 | uVar16 | (ulong)r) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar24 ^ 0xf000000000000),
         ((uVar9 ^ 0x1000003d0) & uVar19 & uVar16 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_00154b1e;
      sStack_1e0.n[0] = psVar23->n[0];
      sStack_1e0.n[1] = psVar23->n[1];
      sStack_1e0.n[2] = psVar23->n[2];
      sStack_1e0.n[3] = psVar23->n[3];
      sStack_1e0.n[4] = psVar23->n[4];
      sStack_1e0.magnitude = psVar23->magnitude;
      sStack_1e0.normalized = psVar23->normalized;
      psVar23 = &sStack_1e0;
      pcStack_238 = (code *)0x15479d;
      secp256k1_fe_verify(psVar23);
      r_00 = &fe_minus_one;
      pcStack_238 = (code *)0x1547a9;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_1e0.magnitude) goto LAB_00154b23;
      uVar20 = sStack_1e0.n[0] + 0xffffefffffc2e;
      uVar42 = sStack_1e0.n[1] + 0xfffffffffffff;
      uVar44 = sStack_1e0.n[2] + 0xfffffffffffff;
      uVar41 = sStack_1e0.n[3] + 0xfffffffffffff;
      uVar38 = sStack_1e0.n[4] + 0xffffffffffff;
      sStack_1e0.normalized = 0;
      sStack_1e0.magnitude = sStack_1e0.magnitude + 1;
      pcStack_238 = (code *)0x15481e;
      sStack_1e0.n[0] = uVar20;
      sStack_1e0.n[1] = uVar42;
      sStack_1e0.n[2] = uVar44;
      sStack_1e0.n[3] = uVar41;
      sStack_1e0.n[4] = uVar38;
      secp256k1_fe_verify(&sStack_1e0);
      pcStack_238 = (code *)0x154826;
      secp256k1_fe_verify(&sStack_1e0);
      a_02 = psStack_1e8;
      uVar9 = (uVar38 >> 0x30) * lStack_228 + uVar20;
      if (((uVar9 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar9 & 0xfffffffffffff) == 0)) {
        uVar38 = uVar38 & 0xffffffffffff;
        uVar27 = uVar42 + (uVar9 >> 0x34);
        uVar19 = (uVar27 >> 0x34) + uVar44;
        uVar16 = (uVar19 >> 0x34) + uVar41;
        uVar24 = (uVar16 >> 0x34) + uVar38;
        if ((((uVar27 | uVar9 | uVar19 | uVar16) & 0xfffffffffffff) == 0 && uVar24 == 0) ||
           (uVar9 = (uVar9 | 0x1000003d0) & uVar27 & uVar19 & uVar16 & (uVar24 ^ 0xf000000000000),
           uVar9 == 0xfffffffffffff)) goto LAB_00154b07;
      }
      r = &sStack_1e0;
      pcStack_238 = (code *)0x1548e6;
      (*(code *)psStack_1e8)();
      psVar23 = &sStack_220;
      pcStack_238 = (code *)0x1548f3;
      secp256k1_fe_verify(psVar23);
      r_00 = &fe_minus_one;
      pcStack_238 = (code *)0x1548ff;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_220.magnitude) goto LAB_00154b28;
      psVar23 = &sStack_220;
      sStack_220.n[0] = sStack_220.n[0] + 0xffffefffffc2e;
      sStack_220.n[1] = sStack_220.n[1] + 0xfffffffffffff;
      sStack_220.n[2] = sStack_220.n[2] + 0xfffffffffffff;
      sStack_220.n[3] = sStack_220.n[3] + 0xfffffffffffff;
      sStack_220.n[4] = sStack_220.n[4] + 0xffffffffffff;
      sStack_220.magnitude = sStack_220.magnitude + 1;
      uVar19 = 0;
      sStack_220.normalized = 0;
      pcStack_238 = (code *)0x154948;
      secp256k1_fe_verify(psVar23);
      pcStack_238 = (code *)0x154951;
      r = psVar23;
      (*(code *)a_02)(psVar23);
      pcStack_238 = (code *)0x154959;
      secp256k1_fe_verify(psVar23);
      sStack_220.n[0] = sStack_220.n[0] + 1;
      sStack_220.magnitude = sStack_220.magnitude + 1;
      sStack_220.normalized = 0;
      pcStack_238 = (code *)0x15496a;
      secp256k1_fe_verify(psVar23);
      pcStack_238 = (code *)0x154972;
      secp256k1_fe_verify(psVar23);
      a_02 = &sStack_1e0;
      pcStack_238 = (code *)0x15497f;
      r_00 = a_02;
      secp256k1_fe_verify(a_02);
      if (sStack_1e0.magnitude + sStack_220.magnitude < 0x21) {
        sStack_220.n[0] = sStack_220.n[0] + sStack_1e0.n[0];
        sStack_220.n[1] = sStack_220.n[1] + sStack_1e0.n[1];
        sStack_220.n[2] = sStack_220.n[2] + sStack_1e0.n[2];
        sStack_220.n[3] = sStack_220.n[3] + sStack_1e0.n[3];
        sStack_220.n[4] = sStack_220.n[4] + sStack_1e0.n[4];
        sStack_220.normalized = 0;
        pcStack_238 = (code *)0x1549cd;
        sStack_220.magnitude = sStack_1e0.magnitude + sStack_220.magnitude;
        secp256k1_fe_verify(&sStack_220);
        pcStack_238 = (code *)0x1549d5;
        secp256k1_fe_verify(&sStack_220);
        uVar9 = (sStack_220.n[4] >> 0x30) * lStack_228 + sStack_220.n[0];
        if (((uVar9 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar9 & 0xfffffffffffff) == 0)) {
          uVar16 = (uVar9 >> 0x34) + sStack_220.n[1];
          uVar24 = (uVar16 >> 0x34) + sStack_220.n[2];
          uVar27 = (uVar24 >> 0x34) + sStack_220.n[3];
          uVar31 = (uVar27 >> 0x34) + (sStack_220.n[4] & 0xffffffffffff);
          if ((((uVar16 | uVar9 | uVar24 | uVar27) & 0xfffffffffffff) == 0 && uVar31 == 0) ||
             (uVar9 = (uVar9 | 0x1000003d0) & uVar16 & uVar24 & uVar27 & (uVar31 ^ 0xf000000000000),
             uVar9 == 0xfffffffffffff)) goto LAB_00154b07;
        }
        pcStack_238 = (code *)0x154a90;
        test_inverse_field_cold_2();
        goto LAB_00154a90;
      }
    }
    else {
      pcStack_238 = (code *)0x154b1e;
      test_inverse_field_cold_7();
LAB_00154b1e:
      pcStack_238 = (code *)0x154b23;
      test_inverse_field_cold_6();
LAB_00154b23:
      a_02 = &sStack_1b0;
      pcStack_238 = (code *)0x154b28;
      test_inverse_field_cold_5();
LAB_00154b28:
      uVar19 = 0xffffffffffff;
      pcStack_238 = (code *)0x154b2d;
      test_inverse_field_cold_4();
    }
    pcStack_238 = (code *)0x154b32;
    test_inverse_field_cold_3();
  }
  pcStack_238 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar28 = (secp256k1_fe *)auStack_2a8;
  pcVar45 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar45 = secp256k1_scalar_inverse;
  }
  pcStack_2b0 = (code *)0x154b60;
  auStack_268._32_8_ = psVar23;
  auStack_268._40_8_ = a_02;
  pcStack_238 = (code *)uVar44;
  (*pcVar45)(auStack_2a8);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_2a8._20_4_,auStack_2a8._16_4_);
    r_00->n[3] = CONCAT44(auStack_2a8._28_4_,auStack_2a8._24_4_);
    r_00->n[0] = CONCAT44(auStack_2a8._4_4_,auStack_2a8._0_4_);
    r_00->n[1] = CONCAT44(auStack_2a8._12_4_,auStack_2a8._8_4_);
  }
  pcStack_2b0 = (code *)0x154b7f;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar47._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar47._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar47._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar47._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar4 = movmskps(extraout_EAX,auVar47);
  if (iVar4 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_268;
    pcStack_2b0 = (code *)0x154bb3;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_2a8);
    pcStack_2b0 = (code *)0x154bbb;
    psVar23 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_268._0_8_ != 1 || auStack_268._8_8_ != 0) || auStack_268._16_8_ != 0) ||
        auStack_268._24_8_ != 0) {
      pcStack_2b0 = (code *)0x154cc5;
      test_inverse_scalar_cold_1();
      goto LAB_00154cc5;
    }
    pcStack_2b0 = (code *)0x154beb;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_2a8 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_2b0 = (code *)0x154bf3;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_2a8 + 0x20));
    auVar48._0_4_ = -(uint)(iStack_278 == 0 && auStack_2a8._32_4_ == 0);
    auVar48._4_4_ = -(uint)(iStack_274 == 0 && iStack_284 == 0);
    auVar48._8_4_ = -(uint)(iStack_270 == 0 && iStack_280 == 0);
    auVar48._12_4_ = -(uint)(iStack_26c == 0 && iStack_27c == 0);
    uVar3 = movmskps(extraout_EAX_00,auVar48);
    if (uVar3 == 0xf) {
      return 0;
    }
    a_00 = (secp256k1_scalar *)(auStack_2a8 + 0x20);
    pcStack_2b0 = (code *)0x154c24;
    (*pcVar45)(a_00,a_00);
    pcStack_2b0 = (code *)0x154c39;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_2a8,&scalar_minus_one,(secp256k1_scalar *)auStack_2a8);
    pcStack_2b0 = (code *)0x154c42;
    (*pcVar45)(auStack_2a8,auStack_2a8);
    pcStack_2b0 = (code *)0x154c54;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_2a8,(secp256k1_scalar *)auStack_2a8,&secp256k1_scalar_one
              );
    pcStack_2b0 = (code *)0x154c62;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_2a8,a_00,(secp256k1_scalar *)auStack_2a8);
    pcStack_2b0 = (code *)0x154c6a;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_2a8);
    auVar49._0_4_ = -(uint)(auStack_2a8._16_4_ == 0 && auStack_2a8._0_4_ == 0);
    auVar49._4_4_ = -(uint)(auStack_2a8._20_4_ == 0 && auStack_2a8._4_4_ == 0);
    auVar49._8_4_ = -(uint)(auStack_2a8._24_4_ == 0 && auStack_2a8._8_4_ == 0);
    auVar49._12_4_ = -(uint)(auStack_2a8._28_4_ == 0 && auStack_2a8._12_4_ == 0);
    uVar3 = movmskps(extraout_EAX_01,auVar49);
    if (uVar3 == 0xf) {
      return 0;
    }
    pcStack_2b0 = (code *)0x154c8e;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_2a8;
  }
  pcStack_2b0 = (code *)0x154c99;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_2a8);
  auVar50._0_4_ = -(uint)(auStack_2a8._16_4_ == 0 && auStack_2a8._0_4_ == 0);
  auVar50._4_4_ = -(uint)(auStack_2a8._20_4_ == 0 && auStack_2a8._4_4_ == 0);
  auVar50._8_4_ = -(uint)(auStack_2a8._24_4_ == 0 && auStack_2a8._8_4_ == 0);
  auVar50._12_4_ = -(uint)(auStack_2a8._28_4_ == 0 && auStack_2a8._12_4_ == 0);
  uVar3 = movmskps(extraout_EAX_02,auVar50);
  r = (secp256k1_fe *)auStack_2a8;
  psVar23 = psVar28;
  if (uVar3 == 0xf) {
    return 0;
  }
LAB_00154cc5:
  pcStack_2b0 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1360;
  psStack_2d8 = r;
  uStack_2d0 = uVar38;
  uStack_2c8 = uVar41;
  psStack_2c0 = r_00;
  pcStack_2b8 = pcVar45;
  pcStack_2b0 = (code *)uVar19;
  memset(__s,0,0x1081);
  uStack_1370 = 0;
  lVar8 = 0x41;
  psStack_1368 = psVar23;
  secp256k1_hsort(__s,0x41,(size_t)psVar23,test_hsort_cmp,&uStack_1370);
  if (0x3f < uStack_1370) {
    test_hsort_is_sorted(auStack_1360,0x41,(size_t)psVar23);
    iVar4 = extraout_EAX_03;
    if (0 < COUNT) {
      iVar18 = 0;
      do {
        uVar7 = testrand_int(0x41);
        count = (size_t)(int)uVar7;
        testrand_bytes_test(auStack_1360,count * (long)psVar23);
        secp256k1_hsort(auStack_1360,count,(size_t)psVar23,test_hsort_cmp,&uStack_1370);
        test_hsort_is_sorted(auStack_1360,count,(size_t)psVar23);
        iVar18 = iVar18 + 1;
        iVar4 = extraout_EAX_04;
      } while (iVar18 < COUNT);
    }
    return iVar4;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar34 = 0;
    do {
      iVar4 = (uint)__s[lVar34] - (uint)*(byte *)(lVar8 + lVar34);
      if (iVar4 != 0) {
        return iVar4;
      }
      lVar34 = lVar34 + 1;
    } while (extraout_RDX_01[1] != lVar34);
  }
  return 0;
}

Assistant:

static int secp256k1_modinv32_mul_cmp_30(const secp256k1_modinv32_signed30 *a, int alen, const secp256k1_modinv32_signed30 *b, int32_t factor) {
    int i;
    secp256k1_modinv32_signed30 am, bm;
    secp256k1_modinv32_mul_30(&am, a, alen, 1); /* Normalize all but the top limb of a. */
    secp256k1_modinv32_mul_30(&bm, b, 9, factor);
    for (i = 0; i < 8; ++i) {
        /* Verify that all but the top limb of a and b are normalized. */
        VERIFY_CHECK(am.v[i] >> 30 == 0);
        VERIFY_CHECK(bm.v[i] >> 30 == 0);
    }
    for (i = 8; i >= 0; --i) {
        if (am.v[i] < bm.v[i]) return -1;
        if (am.v[i] > bm.v[i]) return 1;
    }
    return 0;
}